

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::closeEvent(QWidgetWindow *this,QCloseEvent *event)

{
  bool bVar1;
  undefined8 extraout_RDX;
  long *in_RSI;
  QWidgetPrivate *in_RDI;
  bool accepted;
  QWidgetWindowPrivate *d;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  QWidgetPrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QWidgetWindow *)0x3b7e70);
  bVar1 = ::operator==((QWidget **)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                       (QPointer<QWidget> *)in_RDI);
  if (bVar1) {
    qt_popup_down = (QWidget *)0x0;
    qt_popup_down_closed = true;
  }
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7eae);
  QWidget::d_func((QWidget *)0x3b7eb6);
  bVar1 = QWidgetPrivate::handleClose(this_00,(CloseMode)((ulong)in_RSI >> 0x20));
  (**(code **)(*in_RSI + 0x10))(in_RSI,bVar1,extraout_RDX,bVar1);
  return;
}

Assistant:

void QWidgetWindow::closeEvent(QCloseEvent *event)
{
    Q_D(QWidgetWindow);
    if (qt_popup_down == m_widget) {
        qt_popup_down = nullptr;
        qt_popup_down_closed = true;
    }
    bool accepted = m_widget->d_func()->handleClose(d->inClose ? QWidgetPrivate::CloseWithEvent
                                                                  : QWidgetPrivate::CloseWithSpontaneousEvent);
    event->setAccepted(accepted);
}